

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaParserCtxtPtr xmlSchemaNewMemParserCtxt(char *buffer,int size)

{
  xmlDictPtr pxVar1;
  xmlSchemaParserCtxtPtr ret;
  int size_local;
  char *buffer_local;
  
  if ((buffer == (char *)0x0) || (size < 1)) {
    buffer_local = (char *)0x0;
  }
  else {
    buffer_local = (char *)xmlSchemaParserCtxtCreate();
    if ((xmlSchemaParserCtxtPtr)buffer_local == (xmlSchemaParserCtxtPtr)0x0) {
      buffer_local = (char *)0x0;
    }
    else {
      ((xmlSchemaParserCtxtPtr)buffer_local)->buffer = buffer;
      ((xmlSchemaParserCtxtPtr)buffer_local)->size = size;
      pxVar1 = xmlDictCreate();
      ((xmlSchemaParserCtxtPtr)buffer_local)->dict = pxVar1;
    }
  }
  return (xmlSchemaParserCtxtPtr)buffer_local;
}

Assistant:

xmlSchemaParserCtxtPtr
xmlSchemaNewMemParserCtxt(const char *buffer, int size)
{
    xmlSchemaParserCtxtPtr ret;

    if ((buffer == NULL) || (size <= 0))
        return (NULL);
    ret = xmlSchemaParserCtxtCreate();
    if (ret == NULL)
	return(NULL);
    ret->buffer = buffer;
    ret->size = size;
    ret->dict = xmlDictCreate();
    return (ret);
}